

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_objlen(lua_State *L,StkId ra,TValue *rb)

{
  Table *t;
  lua_Unsigned lVar1;
  Value VVar2;
  Value VVar3;
  RaviArray *local_70;
  RaviArray *local_68;
  TValue *io_3;
  TValue *io_2;
  TValue *io_1;
  Table *h_1;
  TValue *io;
  RaviArray *h;
  TValue *tm;
  TValue *rb_local;
  StkId ra_local;
  lua_State *L_local;
  
  switch(rb->tt_ & 0x7f) {
  case 4:
    if ((rb->tt_ & 0xf) != 4) {
      __assert_fail("(((((((rb))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x361,"void luaV_objlen(lua_State *, StkId, const TValue *)");
    }
    if ((((rb->value_).gc)->tt & 0xf) != 4) {
      __assert_fail("(((((rb)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x361,"void luaV_objlen(lua_State *, StkId, const TValue *)");
    }
    VVar3.i._1_7_ = 0;
    VVar3.b._0_1_ = (rb->value_).f[0xb];
    ra->value_ = VVar3;
    ra->tt_ = 0x13;
    break;
  case 5:
    if (rb->tt_ != 0x8005) {
      __assert_fail("((((rb))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x35a,"void luaV_objlen(lua_State *, StkId, const TValue *)");
    }
    if (((rb->value_).gc)->tt != '\x05') {
      __assert_fail("(((rb)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x35a,"void luaV_objlen(lua_State *, StkId, const TValue *)");
    }
    t = (Table *)(rb->value_).gc;
    if (t->metatable == (Table *)0x0) {
      local_68 = (RaviArray *)0x0;
    }
    else {
      if ((t->metatable->flags & 0x10) == 0) {
        local_70 = (RaviArray *)luaT_gettm(t->metatable,TM_LEN,L->l_G->tmname[4]);
      }
      else {
        local_70 = (RaviArray *)0x0;
      }
      local_68 = local_70;
    }
    h = local_68;
    if (local_68 == (RaviArray *)0x0) {
      lVar1 = luaH_getn(t);
      (ra->value_).i = lVar1;
      ra->tt_ = 0x13;
      return;
    }
    goto LAB_0014761f;
  default:
    h = (RaviArray *)luaT_gettmbyobj(L,rb,TM_LEN);
    if (*(LuaType *)&h->tt == 0) {
      luaG_typeerror(L,rb,"get length of");
    }
LAB_0014761f:
    luaT_callTM(L,(TValue *)h,rb,rb,ra,1);
    break;
  case 0x14:
    if ((rb->tt_ & 0xf) != 4) {
      __assert_fail("(((((((rb))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x365,"void luaV_objlen(lua_State *, StkId, const TValue *)");
    }
    if ((((rb->value_).gc)->tt & 0xf) != 4) {
      __assert_fail("(((((rb)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x365,"void luaV_objlen(lua_State *, StkId, const TValue *)");
    }
    ra->value_ = *(Value *)((rb->value_).f + 0x10);
    ra->tt_ = 0x13;
    break;
  case 0x15:
  case 0x25:
    if ((rb->tt_ != 0x8015) && (rb->tt_ != 0x8025)) {
      __assert_fail("(((((rb))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((rb))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x355,"void luaV_objlen(lua_State *, StkId, const TValue *)");
    }
    if ((((rb->value_).gc)->tt != '\x15') && (((rb->value_).gc)->tt != '%')) {
      __assert_fail("((((rb)->value_).gc)->tt == ((5) | ((1) << 4)) || (((rb)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x355,"void luaV_objlen(lua_State *, StkId, const TValue *)");
    }
    VVar2.i._4_4_ = 0;
    VVar2.b = *(int *)((rb->value_).f + 0xc) - 1;
    ra->value_ = VVar2;
    ra->tt_ = 0x13;
  }
  return;
}

Assistant:

void luaV_objlen (lua_State *L, StkId ra, const TValue *rb) {
  const TValue *tm;
  switch (ttype(rb)) {
    case RAVI_TIARRAY:
    case RAVI_TFARRAY: {
      RaviArray *h = arrvalue(rb);
      setivalue(ra, raviH_getn(h));
      return;
    }
    case LUA_TTABLE: {
      Table *h = hvalue(rb);
      tm = fasttm(L, h->metatable, TM_LEN);
      if (tm) break;  /* metamethod? break switch to call it */
      setivalue(ra, luaH_getn(h));  /* else primitive len */
      return;
    }
    case LUA_TSHRSTR: {
      setivalue(ra, tsvalue(rb)->shrlen);
      return;
    }
    case LUA_TLNGSTR: {
      setivalue(ra, tsvalue(rb)->u.lnglen);
      return;
    }
    default: {  /* try metamethod */
      tm = luaT_gettmbyobj(L, rb, TM_LEN);
      if (unlikely(ttisnil(tm)))  /* no metamethod? */
        luaG_typeerror(L, rb, "get length of");
      break;
    }
  }
  luaT_callTM(L, tm, rb, rb, ra, 1);
}